

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

bool __thiscall
duckdb::BlockIndexManager::RemoveIndex(BlockIndexManager *this,idx_t index,TemporaryBufferSize size)

{
  _Rb_tree_header *p_Var1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  _Base_ptr p_Var2;
  const_iterator __position;
  long lVar3;
  InternalException *this_01;
  _Base_ptr p_Var4;
  ulong new_index;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar5;
  unsigned_long max_entry;
  idx_t local_60;
  ulong local_58;
  string local_50;
  
  p_Var1 = &(this->indexes_in_use)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->indexes_in_use)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < index]) {
    if (*(ulong *)(p_Var2 + 1) >= index) {
      p_Var4 = p_Var2;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (__position._M_node = p_Var4, index < *(ulong *)(p_Var4 + 1))) {
    __position._M_node = &p_Var1->_M_header;
  }
  local_60 = index;
  if ((_Rb_tree_header *)__position._M_node == p_Var1) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"RemoveIndex - index %llu not found in indexes_in_use","");
    InternalException::InternalException<unsigned_long>(this_01,&local_50,local_60);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&this->indexes_in_use,__position);
  this_00 = &this->free_indexes;
  ::std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::_M_insert_unique<unsigned_long_const&>
            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              *)this_00,&local_60);
  if ((this->indexes_in_use)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    new_index = 0;
  }
  else {
    lVar3 = ::std::_Rb_tree_decrement(&p_Var1->_M_header);
    new_index = *(long *)(lVar3 + 0x20) + 1;
  }
  local_58 = this->max_index;
  if ((new_index < local_58) &&
     (SetMaxIndex(this,new_index,size),
     (this->free_indexes)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    do {
      lVar3 = ::std::_Rb_tree_decrement
                        (&(this->free_indexes)._M_t._M_impl.super__Rb_tree_header._M_header);
      local_50._M_dataplus._M_p = *(pointer *)(lVar3 + 0x20);
      if (local_50._M_dataplus._M_p < (pointer)this->max_index) break;
      pVar5 = ::std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::equal_range(&this_00->_M_t,(key_type *)&local_50);
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
    } while ((this->free_indexes)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0);
  }
  return new_index < local_58;
}

Assistant:

bool BlockIndexManager::RemoveIndex(idx_t index, const TemporaryBufferSize size) {
	// remove this block from the set of blocks
	auto entry = indexes_in_use.find(index);
	if (entry == indexes_in_use.end()) {
		throw InternalException("RemoveIndex - index %llu not found in indexes_in_use", index);
	}
	indexes_in_use.erase(entry);
	free_indexes.insert(index);
	// check if we can truncate the file

	// get the max_index in use right now
	auto max_index_in_use = indexes_in_use.empty() ? 0 : *indexes_in_use.rbegin() + 1;
	if (max_index_in_use < max_index) {
		// max index in use is lower than the max_index
		// reduce the max_index
		SetMaxIndex(max_index_in_use, size);
		// we can remove any free_indexes that are larger than the current max_index
		while (HasFreeBlocks()) {
			auto max_entry = *free_indexes.rbegin();
			if (max_entry < max_index) {
				break;
			}
			free_indexes.erase(max_entry);
		}
		return true;
	}
	return false;
}